

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_mq.c
# Opt level: O0

void skynet_mq_push(message_queue *q,skynet_message *message)

{
  int iVar1;
  skynet_message *psVar2;
  skynet_message *message_local;
  message_queue *q_local;
  
  if (message != (skynet_message *)0x0) {
    spinlock_lock(&q->lock);
    psVar2 = q->queue + q->tail;
    iVar1 = message->session;
    psVar2->source = message->source;
    psVar2->session = iVar1;
    psVar2->data = message->data;
    psVar2->sz = message->sz;
    iVar1 = q->tail + 1;
    q->tail = iVar1;
    if (q->cap <= iVar1) {
      q->tail = 0;
    }
    if (q->head == q->tail) {
      expand_queue(q);
    }
    if (q->in_global == 0) {
      q->in_global = 1;
      skynet_globalmq_push(q);
    }
    spinlock_unlock(&q->lock);
    return;
  }
  __assert_fail("message",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_mq.c"
                ,0xbf,"void skynet_mq_push(struct message_queue *, struct skynet_message *)");
}

Assistant:

void 
skynet_mq_push(struct message_queue *q, struct skynet_message *message) {
	assert(message);
	SPIN_LOCK(q)

	q->queue[q->tail] = *message;
	if (++ q->tail >= q->cap) {
		q->tail = 0;
	}

	if (q->head == q->tail) {
		expand_queue(q);
	}

	if (q->in_global == 0) {
		q->in_global = MQ_IN_GLOBAL;
		skynet_globalmq_push(q);
	}
	
	SPIN_UNLOCK(q)
}